

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

void __thiscall
p2t::Sweep::FlipEdgeEvent(Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *t,Point *p)

{
  Edge *pEVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  Triangle *this_00;
  Point *pd;
  Point *pb;
  Point *pc;
  Point *pPVar5;
  uint o;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  do {
    this_00 = Triangle::NeighborAcross(t,p);
    pd = Triangle::OppositePoint(this_00,t,p);
    pb = Triangle::PointCCW(t,p);
    pc = Triangle::PointCW(t,p);
    pPVar5 = p;
    bVar4 = InScanArea(p,pb,pc,pd);
    if (!bVar4) {
      pPVar5 = NextFlipPoint((Sweep *)pPVar5,ep,eq,this_00,pd);
      FlipScanEdgeEvent(this,tcx,ep,eq,t,this_00,pPVar5);
      EdgeEvent(this,tcx,ep,eq,t,p);
      return;
    }
    RotateTrianglePair((Sweep *)pPVar5,t,p,this_00,pd);
    SweepContext::MapTriangleToNodes(tcx,t);
    SweepContext::MapTriangleToNodes(tcx,this_00);
    dVar2 = eq->x;
    dVar3 = eq->y;
    dVar6 = ep->x;
    if ((((p->x != dVar2) || (NAN(p->x) || NAN(dVar2))) || (p->y != dVar3)) ||
       (NAN(p->y) || NAN(dVar3))) {
      dVar7 = ep->y;
      dVar8 = pd->x;
      dVar9 = pd->y;
    }
    else {
      dVar8 = pd->x;
      dVar9 = pd->y;
      dVar7 = ep->y;
      if (((dVar8 == dVar6) && (!NAN(dVar8) && !NAN(dVar6))) &&
         ((dVar9 == dVar7 && (!NAN(dVar9) && !NAN(dVar7))))) {
        pEVar1 = (tcx->edge_event).constrained_edge;
        pPVar5 = pEVar1->q;
        if (((dVar2 == pPVar5->x) && (!NAN(dVar2) && !NAN(pPVar5->x))) &&
           ((dVar3 == pPVar5->y && (!NAN(dVar3) && !NAN(pPVar5->y))))) {
          pPVar5 = pEVar1->p;
          if ((((dVar6 == pPVar5->x) && (!NAN(dVar6) && !NAN(pPVar5->x))) && (dVar7 == pPVar5->y))
             && (!NAN(dVar7) && !NAN(pPVar5->y))) {
            Triangle::MarkConstrainedEdge(t,ep,eq);
            Triangle::MarkConstrainedEdge(this_00,ep,eq);
            Legalize(this,tcx,t);
            Legalize(this,tcx,this_00);
            return;
          }
        }
        return;
      }
    }
    dVar6 = (dVar9 - dVar7) * (dVar2 - dVar6) - (dVar8 - dVar6) * (dVar3 - dVar7);
    o = (uint)(0.0 < dVar6);
    if (ABS(dVar6) < 1e-12) {
      o = 2;
    }
    t = NextFlipTriangle(this,tcx,o,t,this_00,p,pd);
  } while( true );
}

Assistant:

void Sweep::FlipEdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle* t, Point& p)
{
  Triangle& ot = t->NeighborAcross(p);
  Point& op = *ot.OppositePoint(*t, p);

  if (InScanArea(p, *t->PointCCW(p), *t->PointCW(p), op)) {
    // Lets rotate shared edge one vertex CW
    RotateTrianglePair(*t, p, ot, op);
    tcx.MapTriangleToNodes(*t);
    tcx.MapTriangleToNodes(ot);

    if (p == eq && op == ep) {
      if (eq == *tcx.edge_event.constrained_edge->q && ep == *tcx.edge_event.constrained_edge->p) {
        t->MarkConstrainedEdge(&ep, &eq);
        ot.MarkConstrainedEdge(&ep, &eq);
        Legalize(tcx, *t);
        Legalize(tcx, ot);
      } else {
        // XXX: I think one of the triangles should be legalized here?
      }
    } else {
      Orientation o = Orient2d(eq, op, ep);
      t = &NextFlipTriangle(tcx, (int)o, *t, ot, p, op);
      FlipEdgeEvent(tcx, ep, eq, t, p);
    }
  } else {
    Point& newP = NextFlipPoint(ep, eq, ot, op);
    FlipScanEdgeEvent(tcx, ep, eq, *t, ot, newP);
    EdgeEvent(tcx, ep, eq, t, p);
  }
}